

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arm.cpp
# Opt level: O0

bool ArmDirectiveArm(ArgumentList *List,int flags)

{
  ArmStateCommand *this;
  ArmStateCommand *cmd;
  int flags_local;
  ArgumentList *List_local;
  
  CArmArchitecture::SetThumbMode(&Arm,false);
  this = (ArmStateCommand *)operator_new(0x20);
  ArmStateCommand::ArmStateCommand(this,true);
  AddAssemblerCommand((CAssemblerCommand *)this);
  return true;
}

Assistant:

bool ArmDirectiveArm(ArgumentList& List, int flags)
{
	Arm.SetThumbMode(false);
	ArmStateCommand* cmd = new ArmStateCommand(true);
	AddAssemblerCommand(cmd);
	return true;
}